

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_split(REF_SHARD ref_shard)

{
  REF_GRID pRVar1;
  REF_CELL pRVar2;
  REF_CELL ref_cell;
  REF_STATUS RVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  REF_CELL ref_cell_00;
  REF_BOOL marked;
  REF_INT qua_nodes [5];
  REF_INT new_cell;
  REF_INT hex_nodes [27];
  int local_10c;
  REF_INT local_108;
  REF_INT RStack_104;
  REF_INT RStack_100;
  REF_INT RStack_fc;
  REF_INT RStack_f8;
  REF_INT RStack_f4;
  REF_SHARD local_f0;
  REF_INT local_e8;
  REF_INT RStack_e4;
  REF_INT RStack_e0;
  REF_INT RStack_dc;
  undefined4 uStack_d8;
  REF_INT local_cc;
  REF_INT local_c8;
  REF_INT RStack_c4;
  REF_INT RStack_c0;
  REF_INT RStack_bc;
  REF_INT RStack_b8;
  REF_INT RStack_b4;
  REF_INT RStack_b0;
  REF_INT RStack_ac;
  REF_INT local_58 [2];
  REF_INT RStack_50;
  undefined4 uStack_4c;
  REF_CELL local_40;
  REF_CELL local_38;
  
  pRVar1 = ref_shard->grid;
  ref_cell_00 = pRVar1->cell[0xb];
  local_38 = pRVar1->cell[10];
  pRVar2 = pRVar1->cell[6];
  local_f0 = ref_shard;
  if (0 < pRVar2->max) {
    ref_cell = pRVar1->cell[3];
    iVar7 = 0;
    local_40 = ref_cell_00;
    do {
      RVar3 = ref_cell_nodes(pRVar2,iVar7,&local_e8);
      if (RVar3 == 0) {
        uVar4 = ref_shard_marked(local_f0,local_e8,RStack_e0,&local_10c);
        if (uVar4 != 0) {
          pcVar6 = "0-2";
          uVar5 = 0x11a;
          goto LAB_00199e4a;
        }
        if (local_10c != 0) {
          uVar4 = ref_cell_remove(pRVar2,iVar7);
          if (uVar4 != 0) {
            pcVar6 = "remove qua";
            uVar5 = 0x11c;
            goto LAB_00199e4a;
          }
          local_58[0] = local_e8;
          RStack_50 = RStack_e0;
          uStack_4c = uStack_d8;
          uVar4 = ref_cell_add(ref_cell,local_58,&local_cc);
          if (uVar4 != 0) {
            pcVar6 = "add tri";
            uVar5 = 0x121;
            goto LAB_00199e4a;
          }
          local_58[0] = local_e8;
          RStack_50 = RStack_dc;
          uStack_4c = uStack_d8;
          uVar4 = ref_cell_add(ref_cell,local_58,&local_cc);
          ref_cell_00 = local_40;
          if (uVar4 != 0) {
            pcVar6 = "add tri";
            uVar5 = 0x126;
            goto LAB_00199e4a;
          }
        }
        uVar4 = ref_shard_marked(local_f0,RStack_e4,RStack_dc,&local_10c);
        if (uVar4 != 0) {
          pcVar6 = "1-3";
          uVar5 = 0x129;
          goto LAB_00199e4a;
        }
        if (local_10c != 0) {
          uVar4 = ref_cell_remove(pRVar2,iVar7);
          if (uVar4 != 0) {
            pcVar6 = "remove qua";
            uVar5 = 299;
            goto LAB_00199e4a;
          }
          local_58[0] = local_e8;
          RStack_50 = RStack_dc;
          uStack_4c = uStack_d8;
          uVar4 = ref_cell_add(ref_cell,local_58,&local_cc);
          if (uVar4 != 0) {
            pcVar6 = "add tri";
            uVar5 = 0x130;
            goto LAB_00199e4a;
          }
          local_58[0] = RStack_e4;
          RStack_50 = RStack_dc;
          uStack_4c = uStack_d8;
          uVar4 = ref_cell_add(ref_cell,local_58,&local_cc);
          ref_cell_00 = local_40;
          if (uVar4 != 0) {
            pcVar6 = "add tri";
            uVar5 = 0x135;
            goto LAB_00199e4a;
          }
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < pRVar2->max);
  }
  pRVar2 = local_38;
  if (0 < ref_cell_00->max) {
    iVar7 = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell_00,iVar7,&local_c8);
      if (RVar3 == 0) {
        uVar4 = ref_shard_marked(local_f0,RStack_c4,RStack_b8,&local_10c);
        if (uVar4 != 0) {
          pcVar6 = "1-4";
          uVar5 = 0x13b;
          goto LAB_00199e4a;
        }
        if (local_10c == 0) {
          uVar4 = ref_shard_marked(local_f0,local_c8,RStack_b4,&local_10c);
          if (uVar4 != 0) {
            pcVar6 = "0-5";
            uVar5 = 0x14f;
            goto LAB_00199e4a;
          }
          if (local_10c == 0) {
            uVar4 = ref_shard_marked(local_f0,RStack_c4,RStack_b0,&local_10c);
            if (uVar4 != 0) {
              pcVar6 = "1-6";
              uVar5 = 0x164;
              goto LAB_00199e4a;
            }
            if (local_10c == 0) {
              uVar4 = ref_shard_marked(local_f0,RStack_c0,RStack_b4,&local_10c);
              if (uVar4 != 0) {
                pcVar6 = "2-5";
                uVar5 = 0x178;
LAB_00199e4a:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,uVar5,"ref_shard_split",(ulong)uVar4,pcVar6);
                return uVar4;
              }
              if (local_10c == 0) {
                uVar4 = ref_shard_marked(local_f0,local_c8,RStack_c0,&local_10c);
                if (uVar4 != 0) {
                  pcVar6 = "0-2";
                  uVar5 = 0x18d;
                  goto LAB_00199e4a;
                }
                if (local_10c == 0) {
                  uVar4 = ref_shard_marked(local_f0,RStack_c4,RStack_bc,&local_10c);
                  if (uVar4 != 0) {
                    pcVar6 = "1-3";
                    uVar5 = 0x1a2;
                    goto LAB_00199e4a;
                  }
                  if (local_10c != 0) {
                    uVar4 = ref_cell_remove(ref_cell_00,iVar7);
                    if (uVar4 != 0) {
                      pcVar6 = "remove hex";
                      uVar5 = 0x1a4;
                      goto LAB_00199e4a;
                    }
                    local_108 = local_c8;
                    RStack_104 = RStack_c4;
                    RStack_100 = RStack_bc;
                    RStack_fc = RStack_b8;
                    RStack_f8 = RStack_b4;
                    RStack_f4 = RStack_ac;
                    uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
                    if (uVar4 != 0) {
                      pcVar6 = "add hex pri 1";
                      uVar5 = 0x1ab;
                      goto LAB_00199e4a;
                    }
                    local_108 = RStack_c4;
                    RStack_104 = RStack_c0;
                    RStack_100 = RStack_bc;
                    RStack_fc = RStack_b4;
                    RStack_f8 = RStack_b0;
                    RStack_f4 = RStack_ac;
                    uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
                    if (uVar4 != 0) {
                      pcVar6 = "add hex_pri 2";
                      uVar5 = 0x1b2;
                      goto LAB_00199e4a;
                    }
                  }
                }
                else {
                  uVar4 = ref_cell_remove(ref_cell_00,iVar7);
                  if (uVar4 != 0) {
                    pcVar6 = "remove hex";
                    uVar5 = 399;
                    goto LAB_00199e4a;
                  }
                  local_108 = local_c8;
                  RStack_104 = RStack_c4;
                  RStack_100 = RStack_c0;
                  RStack_fc = RStack_b8;
                  RStack_f8 = RStack_b4;
                  RStack_f4 = RStack_b0;
                  uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
                  if (uVar4 != 0) {
                    pcVar6 = "add hex pri 1";
                    uVar5 = 0x196;
                    goto LAB_00199e4a;
                  }
                  local_108 = local_c8;
                  RStack_104 = RStack_c0;
                  RStack_100 = RStack_bc;
                  RStack_fc = RStack_b8;
                  RStack_f8 = RStack_b0;
                  RStack_f4 = RStack_ac;
                  uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
                  if (uVar4 != 0) {
                    pcVar6 = "add hex_pri 2";
                    uVar5 = 0x19d;
                    goto LAB_00199e4a;
                  }
                }
              }
              else {
                uVar4 = ref_cell_remove(ref_cell_00,iVar7);
                if (uVar4 != 0) {
                  pcVar6 = "remove hex";
                  uVar5 = 0x17a;
                  goto LAB_00199e4a;
                }
                local_108 = RStack_c4;
                RStack_104 = RStack_b4;
                RStack_100 = RStack_c0;
                RStack_fc = local_c8;
                RStack_f8 = RStack_b8;
                RStack_f4 = RStack_bc;
                uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
                if (uVar4 != 0) {
                  pcVar6 = "add hex pri 1";
                  uVar5 = 0x181;
                  goto LAB_00199e4a;
                }
                local_108 = RStack_c0;
                RStack_fc = RStack_bc;
                RStack_f8 = RStack_b8;
                RStack_104 = RStack_b4;
                RStack_100 = RStack_b0;
                RStack_f4 = RStack_ac;
                uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
                if (uVar4 != 0) {
                  pcVar6 = "add hex pri 2";
                  uVar5 = 0x188;
                  goto LAB_00199e4a;
                }
              }
            }
            else {
              uVar4 = ref_cell_remove(ref_cell_00,iVar7);
              if (uVar4 != 0) {
                pcVar6 = "remove hex";
                uVar5 = 0x166;
                goto LAB_00199e4a;
              }
              local_108 = RStack_c4;
              RStack_104 = RStack_b4;
              RStack_100 = RStack_b0;
              RStack_fc = local_c8;
              RStack_f8 = RStack_b8;
              RStack_f4 = RStack_ac;
              uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
              if (uVar4 != 0) {
                pcVar6 = "add hex pri 1";
                uVar5 = 0x16d;
                goto LAB_00199e4a;
              }
              local_108 = RStack_c4;
              RStack_104 = RStack_b0;
              RStack_100 = RStack_c0;
              RStack_fc = local_c8;
              RStack_f8 = RStack_ac;
              RStack_f4 = RStack_bc;
              uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
              if (uVar4 != 0) {
                pcVar6 = "add hex_pri 2";
                uVar5 = 0x174;
                goto LAB_00199e4a;
              }
            }
          }
          else {
            uVar4 = ref_cell_remove(ref_cell_00,iVar7);
            if (uVar4 != 0) {
              pcVar6 = "remove hex";
              uVar5 = 0x151;
              goto LAB_00199e4a;
            }
            local_108 = local_c8;
            RStack_104 = RStack_b4;
            RStack_100 = RStack_c4;
            RStack_fc = RStack_bc;
            RStack_f8 = RStack_b0;
            RStack_f4 = RStack_c0;
            uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
            if (uVar4 != 0) {
              pcVar6 = "add hex pri 1";
              uVar5 = 0x158;
              goto LAB_00199e4a;
            }
            local_108 = RStack_b8;
            RStack_104 = RStack_b4;
            RStack_100 = local_c8;
            RStack_fc = RStack_ac;
            RStack_f8 = RStack_b0;
            RStack_f4 = RStack_bc;
            uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
            if (uVar4 != 0) {
              pcVar6 = "add hex_pri 2";
              uVar5 = 0x15f;
              goto LAB_00199e4a;
            }
          }
        }
        else {
          uVar4 = ref_cell_remove(ref_cell_00,iVar7);
          if (uVar4 != 0) {
            pcVar6 = "remove hex";
            uVar5 = 0x13d;
            goto LAB_00199e4a;
          }
          local_108 = RStack_c4;
          RStack_104 = local_c8;
          RStack_100 = RStack_b8;
          RStack_fc = RStack_c0;
          RStack_f8 = RStack_bc;
          RStack_f4 = RStack_ac;
          uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
          if (uVar4 != 0) {
            pcVar6 = "add hex pri 1";
            uVar5 = 0x144;
            goto LAB_00199e4a;
          }
          local_108 = RStack_c4;
          RStack_104 = RStack_b8;
          RStack_100 = RStack_b4;
          RStack_fc = RStack_c0;
          RStack_f8 = RStack_ac;
          RStack_f4 = RStack_b0;
          uVar4 = ref_cell_add(pRVar2,&local_108,&local_cc);
          if (uVar4 != 0) {
            pcVar6 = "add hex_pri 2";
            uVar5 = 0x14b;
            goto LAB_00199e4a;
          }
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < ref_cell_00->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_shard_split(REF_SHARD ref_shard) {
  REF_GRID ref_grid;
  REF_CELL hex, pri, tri, qua;
  REF_INT cell, hex_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[6], new_cell;
  REF_INT tri_nodes[4], qua_nodes[5];
  REF_BOOL marked;

  ref_grid = ref_shard_grid(ref_shard);
  hex = ref_grid_hex(ref_grid);
  pri = ref_grid_pri(ref_grid);
  tri = ref_grid_tri(ref_grid);
  qua = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    RSS(ref_shard_marked(ref_shard, qua_nodes[0], qua_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
    RSS(ref_shard_marked(ref_shard, qua_nodes[1], qua_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[1];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(hex, cell, hex_nodes) {
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[4], &marked),
        "1-4");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[0];
      pri_nodes[2] = hex_nodes[4];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[3];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[4];
      pri_nodes[2] = hex_nodes[5];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[5], &marked),
        "0-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[1];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[2];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[4];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[0];
      pri_nodes[3] = hex_nodes[7];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[6], &marked),
        "1-6");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[6];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[2], hex_nodes[5], &marked),
        "2-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[2];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[5];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
  }

  return REF_SUCCESS;
}